

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O3

void __thiscall gimage::RAWImageIO::save(RAWImageIO *this,ImageU16 *image,char *name)

{
  ushort uVar1;
  int iVar2;
  IOException *this_00;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  long lVar6;
  ofstream out;
  undefined1 auStack_278 [15];
  allocator local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  int aiStack_208 [4];
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  ios_base local_130 [264];
  
  iVar2 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar2 == '\0') || (image->depth != 1)) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_268,name,&local_269);
    std::operator+(&local_248,"Can only save RAW images with depth 1 (",&local_268);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
    local_228 = (undefined1  [8])*plVar3;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if (local_228 == (undefined1  [8])paVar4) {
      local_218._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_218._8_8_ = plVar3[3];
      local_228 = (undefined1  [8])&local_218;
    }
    else {
      local_218._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_220 = plVar3[1];
    *plVar3 = (long)paVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)local_228);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  anon_unknown_8::writeRAWHeader(name,2,image->width,image->height);
  std::ofstream::ofstream(local_228);
  lVar5 = *(long *)((long)local_228 + -0x18);
  *(undefined4 *)((long)aiStack_208 + lVar5 + -4) = 5;
  std::ios::clear((int)auStack_278 + (int)lVar5 + 0x50);
  std::ofstream::open(local_228,(_Ios_Openmode)name);
  lVar5 = image->height;
  if (0 < lVar5) {
    lVar6 = 0;
    do {
      if (*(int *)((long)aiStack_208 + *(long *)((long)local_228 + -0x18)) != 0) break;
      if (0 < image->width) {
        lVar5 = 0;
        do {
          uVar1 = (*image->img)[lVar6][lVar5];
          if (local_1f8 < local_1f0) {
            *local_1f8 = (char)uVar1;
            local_1f8 = local_1f8 + 1;
          }
          else {
            (**(code **)(local_220 + 0x68))((filebuf *)&local_220,uVar1 & 0xff);
          }
          if (local_1f8 < local_1f0) {
            *local_1f8 = (char)(uVar1 >> 8);
            local_1f8 = local_1f8 + 1;
          }
          else {
            (**(code **)(local_220 + 0x68))((filebuf *)&local_220,uVar1 >> 8);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < image->width);
        lVar5 = image->height;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar5);
  }
  std::ofstream::close();
  local_228 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void RAWImageIO::save(const ImageU16 &image, const char *name) const
{
  if (!handlesFile(name, false) || image.getDepth() != 1)
  {
    throw gutil::IOException("Can only save RAW images with depth 1 ("+std::string(name)+")");
  }

  writeRAWHeader(name, 2, image.getWidth(), image.getHeight());

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        ImageU16::store_t p=image.get(i, k);

        sb->sputc(static_cast<char>(p&0xff));
        sb->sputc(static_cast<char>((p>>8)&0xff));
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}